

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_tree_parse_children(mpack_tree_parser_t *parser,mpack_node_data_t *node)

{
  uint uVar1;
  mpack_node_data_t *pmVar2;
  anon_union_8_7_c87e5bf0_for_value aVar3;
  _Bool _Var4;
  mpack_tree_page_t *pmVar5;
  mpack_level_t *__dest;
  size_t sVar6;
  mpack_tree_error_t UNRECOVERED_JUMPTABLE;
  mpack_error_t mVar7;
  mpack_tree_t *pmVar8;
  size_t sVar9;
  size_t bytes;
  
  uVar1 = node->len;
  bytes = (ulong)uVar1 << (node->type == mpack_type_map);
  _Var4 = mpack_tree_reserve_bytes(parser,bytes);
  if (!_Var4) {
    return;
  }
  if (parser->nodes_left < bytes) {
    pmVar8 = parser->tree;
    if (pmVar8->next == (mpack_tree_page_t *)0x0) {
      if (pmVar8->error != mpack_ok) {
        return;
      }
      pmVar8->error = mpack_error_too_big;
      UNRECOVERED_JUMPTABLE = pmVar8->error_fn;
      if (UNRECOVERED_JUMPTABLE == (mpack_tree_error_t)0x0) {
        return;
      }
      mVar7 = mpack_error_too_big;
      goto LAB_0010a810;
    }
    if (bytes < 0x100 && parser->nodes_left < 0x20) {
      pmVar5 = (mpack_tree_page_t *)malloc(0xff8);
      if (pmVar5 != (mpack_tree_page_t *)0x0) {
        (node->value).children = pmVar5->nodes;
        parser->nodes = pmVar5->nodes + bytes;
        parser->nodes_left = 0xff - bytes;
        goto LAB_0010a723;
      }
    }
    else {
      pmVar5 = (mpack_tree_page_t *)malloc(bytes << 4 | 8);
      if (pmVar5 != (mpack_tree_page_t *)0x0) {
        (node->value).children = pmVar5->nodes;
LAB_0010a723:
        pmVar8 = parser->tree;
        pmVar5->next = pmVar8->next;
        pmVar8->next = pmVar5;
        goto LAB_0010a737;
      }
    }
    if (pmVar8->error != mpack_ok) {
      return;
    }
    pmVar8->error = mpack_error_memory;
    UNRECOVERED_JUMPTABLE = pmVar8->error_fn;
joined_r0x0010a7ec:
    if (UNRECOVERED_JUMPTABLE != (mpack_tree_error_t)0x0) {
      mVar7 = mpack_error_memory;
LAB_0010a810:
      (*UNRECOVERED_JUMPTABLE)(pmVar8,mVar7);
      return;
    }
  }
  else {
    pmVar2 = parser->nodes;
    (node->value).children = pmVar2;
    parser->nodes = pmVar2 + bytes;
    parser->nodes_left = parser->nodes_left - bytes;
    if (uVar1 == 0) {
      return;
    }
LAB_0010a737:
    aVar3 = node->value;
    sVar9 = parser->level + 1;
    if (sVar9 == parser->depth) {
      if (parser->stack_owned == false) {
        __dest = (mpack_level_t *)malloc(sVar9 * 0x20);
        if (__dest == (mpack_level_t *)0x0) goto LAB_0010a7f3;
        memcpy(__dest,parser->stack,sVar9 * 0x10);
        parser->stack = __dest;
        parser->stack_owned = true;
        sVar6 = sVar9;
      }
      else {
        __dest = (mpack_level_t *)realloc(parser->stack,sVar9 * 0x20);
        if (__dest == (mpack_level_t *)0x0) {
LAB_0010a7f3:
          pmVar8 = parser->tree;
          if (pmVar8->error != mpack_ok) {
            return;
          }
          pmVar8->error = mpack_error_memory;
          UNRECOVERED_JUMPTABLE = pmVar8->error_fn;
          goto joined_r0x0010a7ec;
        }
        parser->stack = __dest;
        sVar6 = parser->level + 1;
      }
      parser->depth = sVar9 * 2;
      sVar9 = sVar6;
    }
    else {
      __dest = parser->stack;
    }
    parser->level = sVar9;
    *(anon_union_8_7_c87e5bf0_for_value *)(__dest + sVar9) = aVar3;
    __dest[sVar9].left = bytes;
  }
  return;
}

Assistant:

static void mpack_tree_parse_children(mpack_tree_parser_t* parser, mpack_node_data_t* node) {
    mpack_type_t type = node->type;
    size_t total = node->len;

    // Calculate total elements to read
    if (type == mpack_type_map) {
        if ((uint64_t)total * 2 > (uint64_t)SIZE_MAX) {
            mpack_tree_flag_error(parser->tree, mpack_error_too_big);
            return;
        }
        total *= 2;
    }

    // Each node is at least one byte. Count these bytes now to make
    // sure there is enough data left.
    if (!mpack_tree_reserve_bytes(parser, total))
        return;

    // If there are enough nodes left in the current page, no need to grow
    if (total <= parser->nodes_left) {
        node->value.children = parser->nodes;
        parser->nodes += total;
        parser->nodes_left -= total;

    } else {

        #ifdef MPACK_MALLOC

        // We can't grow if we're using a fixed pool (i.e. we didn't start with a page)
        if (!parser->tree->next) {
            mpack_tree_flag_error(parser->tree, mpack_error_too_big);
            return;
        }

        // Otherwise we need to grow, and the node's children need to be contiguous.
        // This is a heuristic to decide whether we should waste the remaining space
        // in the current page and start a new one, or give the children their
        // own page. With a fraction of 1/8, this causes at most 12% additional
        // waste. Note that reducing this too much causes less cache coherence and
        // more malloc() overhead due to smaller allocations, so there's a tradeoff
        // here. This heuristic could use some improvement, especially with custom
        // page sizes.

        mpack_tree_page_t* page;

        if (total > MPACK_NODES_PER_PAGE || parser->nodes_left > MPACK_NODES_PER_PAGE / 8) {
            page = (mpack_tree_page_t*)MPACK_MALLOC(
                    sizeof(mpack_tree_page_t) + sizeof(mpack_node_data_t) * (total - 1));
            if (page == NULL) {
                mpack_tree_flag_error(parser->tree, mpack_error_memory);
                return;
            }
            mpack_log("allocated seperate page %p for %i children, %i left in page of %i total\n",
                    page, (int)total, (int)parser->nodes_left, (int)MPACK_NODES_PER_PAGE);

            node->value.children = page->nodes;

        } else {
            page = (mpack_tree_page_t*)MPACK_MALLOC(MPACK_PAGE_ALLOC_SIZE);
            if (page == NULL) {
                mpack_tree_flag_error(parser->tree, mpack_error_memory);
                return;
            }
            mpack_log("allocated new page %p for %i children, wasting %i in page of %i total\n",
                    page, (int)total, (int)parser->nodes_left, (int)MPACK_NODES_PER_PAGE);

            node->value.children = page->nodes;
            parser->nodes = page->nodes + total;
            parser->nodes_left = MPACK_NODES_PER_PAGE - total;
        }

        page->next = parser->tree->next;
        parser->tree->next = page;

        #else
        // We can't grow if we don't have an allocator
        mpack_tree_flag_error(parser->tree, mpack_error_too_big);
        return;
        #endif
    }

    mpack_tree_push_stack(parser, node->value.children, total);
}